

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vs_wrapper.hpp
# Opt level: O0

VSFrameRef *
VSInterface::GetFrame<MiniDeen>
          (int n,int activationReason,void **instanceData,void **frameData,VSFrameContext *frameCtx,
          VSCore *core,VSAPI *vsapi)

{
  long *plVar1;
  int iVar2;
  bool bVar3;
  mapped_type *pmVar4;
  VSFrameRef *pVVar5;
  unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
  local_5e8;
  DSFrame local_5b0;
  VSFrameRef *local_4e0;
  VSFrameRef *vs_frame_1;
  DSFrame local_408;
  reference local_338;
  int *i_1;
  iterator __end5;
  iterator __begin5;
  vector<int,_std::allocator<int>_> *__range5;
  undefined1 local_300 [8];
  unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
  in_frames_1;
  unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
  local_2c0;
  DSFrame local_288;
  VSFrameRef *local_1b8;
  VSFrameRef *vs_frame;
  undefined1 local_e0 [8];
  unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
  in_frames;
  int *i;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  vector<int,_std::allocator<int>_> local_78;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> ref_frames;
  VSFetchFrameFunctor *functor;
  MiniDeen *filter;
  VSCore *core_local;
  VSFrameContext *frameCtx_local;
  void **frameData_local;
  void **instanceData_local;
  int activationReason_local;
  int n_local;
  
  plVar1 = (long *)*instanceData;
  ref_frames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)plVar1[0xc];
  if (ref_frames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    *(VSFrameContext **)
     (ref_frames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage + 8) = frameCtx;
  }
  instanceData_local._0_4_ = activationReason;
  instanceData_local._4_4_ = n;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_60);
  if ((int)instanceData_local == 0) {
    if (ref_frames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage == (pointer)0x0) {
      std::
      unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
      ::unordered_map((unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
                       *)local_e0);
      DSFrame::DSFrame((DSFrame *)&vs_frame,core,vsapi);
      pmVar4 = std::
               unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
               ::operator[]((unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
                             *)local_e0,(key_type *)((long)&instanceData_local + 4));
      DSFrame::operator=(pmVar4,(DSFrame *)&vs_frame);
      DSFrame::~DSFrame((DSFrame *)&vs_frame);
      iVar2 = instanceData_local._4_4_;
      std::
      unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
      ::unordered_map(&local_2c0,
                      (unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
                       *)local_e0);
      (**(code **)(*plVar1 + 0x48))(&local_288,plVar1,iVar2,&local_2c0);
      pVVar5 = DSFrame::ToVSFrame(&local_288);
      DSFrame::~DSFrame(&local_288);
      std::
      unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
      ::~unordered_map(&local_2c0);
      in_frames_1._M_h._M_single_bucket._4_4_ = 1;
      local_1b8 = pVVar5;
      _activationReason_local = pVVar5;
      std::
      unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
      ::~unordered_map((unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
                        *)local_e0);
      goto LAB_0012cac0;
    }
    (**(code **)(*plVar1 + 0x40))(&local_78,plVar1,instanceData_local._4_4_);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)local_60,&local_78);
    std::vector<int,_std::allocator<int>_>::~vector(&local_78);
    __end4 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_60);
    i = (int *)std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_60);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&i), bVar3) {
      in_frames._M_h._M_single_bucket =
           (__node_base_ptr)
           __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (&__end4);
      (*vsapi->requestFrameFilter)
                (*(int *)&(in_frames._M_h._M_single_bucket)->_M_nxt,
                 *(VSNodeRef **)
                  (ref_frames.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 2),frameCtx);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end4);
    }
  }
  else if ((int)instanceData_local == 2) {
    std::
    unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
    ::unordered_map((unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
                     *)local_300);
    if (ref_frames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage == (pointer)0x0) {
      DSFrame::DSFrame((DSFrame *)&vs_frame_1,core,vsapi);
      pmVar4 = std::
               unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
               ::operator[]((unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
                             *)local_300,(key_type *)((long)&instanceData_local + 4));
      DSFrame::operator=(pmVar4,(DSFrame *)&vs_frame_1);
      DSFrame::~DSFrame((DSFrame *)&vs_frame_1);
    }
    else {
      (**(code **)(*plVar1 + 0x40))(&__range5,plVar1,instanceData_local._4_4_);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)local_60,
                 (vector<int,_std::allocator<int>_> *)&__range5);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&__range5);
      __end5 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_60);
      i_1 = (int *)std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)local_60);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end5,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)&i_1), bVar3) {
        local_338 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end5);
        pVVar5 = (*vsapi->getFrameFilter)
                           (*local_338,
                            *(VSNodeRef **)
                             (ref_frames.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 2),frameCtx);
        DSFrame::DSFrame(&local_408,pVVar5,core,vsapi);
        pmVar4 = std::
                 unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
                 ::operator[]((unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
                               *)local_300,local_338);
        DSFrame::operator=(pmVar4,&local_408);
        DSFrame::~DSFrame(&local_408);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end5);
      }
    }
    iVar2 = instanceData_local._4_4_;
    std::
    unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
    ::unordered_map(&local_5e8,
                    (unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
                     *)local_300);
    (**(code **)(*plVar1 + 0x48))(&local_5b0,plVar1,iVar2,&local_5e8);
    pVVar5 = DSFrame::ToVSFrame(&local_5b0);
    DSFrame::~DSFrame(&local_5b0);
    std::
    unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
    ::~unordered_map(&local_5e8);
    in_frames_1._M_h._M_single_bucket._4_4_ = 1;
    local_4e0 = pVVar5;
    _activationReason_local = pVVar5;
    std::
    unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
    ::~unordered_map((unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
                      *)local_300);
    goto LAB_0012cac0;
  }
  _activationReason_local = (VSFrameRef *)0x0;
  in_frames_1._M_h._M_single_bucket._4_4_ = 1;
LAB_0012cac0:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
  return _activationReason_local;
}

Assistant:

const VSFrameRef* VS_CC GetFrame(int n, int activationReason, void **instanceData, void **frameData, VSFrameContext *frameCtx, VSCore *core, const VSAPI *vsapi) {
    auto filter = reinterpret_cast<FilterType*>(*instanceData);
    auto functor = reinterpret_cast<VSFetchFrameFunctor*>(filter->fetch_frame);
    if (functor)
      functor->_frameCtx = frameCtx;

    std::vector<int> ref_frames;
    if (activationReason == VSActivationReason::arInitial) {
      if (functor) {
        ref_frames = filter->RequestReferenceFrames(n);
        for (auto &&i : ref_frames)
          vsapi->requestFrameFilter(i, functor->_vs_clip, frameCtx);
      }
      else {
        std::unordered_map<int, DSFrame> in_frames;
        in_frames[n] = DSFrame(core, vsapi);
        auto vs_frame = (filter->GetFrame(n, in_frames).ToVSFrame());
        return vs_frame;
      }
    }
    else if (activationReason == VSActivationReason::arAllFramesReady) {
      std::unordered_map<int, DSFrame> in_frames;
      if (functor) {
        ref_frames = filter->RequestReferenceFrames(n);
        for (auto &&i : ref_frames)
          in_frames[i] = DSFrame(vsapi->getFrameFilter(i, functor->_vs_clip, frameCtx), core, vsapi);
      }
      else
        in_frames[n] = DSFrame(core, vsapi);

      auto vs_frame = (filter->GetFrame(n, in_frames).ToVSFrame());
      return vs_frame;
    }
    return nullptr;
  }